

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprRefFunc
          (BinaryReaderIR *this,Index index,Index func_index)

{
  intrusive_list<wabt::Expr> *this_00;
  pointer *__ptr;
  Location loc;
  Expr *local_98;
  _Head_base<0UL,_wabt::Expr_*,_false> local_90;
  Location local_88;
  Var local_68;
  
  GetLocation(&local_88,this);
  this_00 = this->current_init_expr_;
  Var::Var(&local_68,func_index,&local_88);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)34>,wabt::Var,wabt::Location&>
            ((wabt *)&local_98,&local_68,&local_88);
  local_90._M_head_impl = local_98;
  local_98 = (Expr *)0x0;
  intrusive_list<wabt::Expr>::push_back
            (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_90);
  if (local_90._M_head_impl != (Expr *)0x0) {
    (*(local_90._M_head_impl)->_vptr_Expr[1])();
  }
  local_90._M_head_impl = (Expr *)0x0;
  if (local_98 != (Expr *)0x0) {
    (**(code **)(*(long *)local_98 + 8))();
  }
  local_98 = (Expr *)0x0;
  Var::~Var(&local_68);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprRefFunc(Index index, Index func_index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<RefFuncExpr>(Var(func_index, loc), loc));
  return Result::Ok;
}